

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_objects.cpp
# Opt level: O3

void __thiscall
ear::GainCalculatorObjectsImpl::GainCalculatorObjectsImpl
          (GainCalculatorObjectsImpl *this,Layout *layout)

{
  shared_ptr<ear::PointSourcePanner> *this_00;
  pointer pcVar1;
  uint uVar2;
  Layout local_98;
  
  (this->_layout)._name._M_dataplus._M_p = (pointer)&(this->_layout)._name.field_2;
  pcVar1 = (layout->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (layout->_name)._M_string_length);
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::vector
            (&(this->_layout)._channels,&layout->_channels);
  (this->_layout)._screen.super_type.m_initialized = false;
  if ((layout->_screen).super_type.m_initialized == true) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::variant
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)
               &(this->_layout)._screen.super_type.m_storage,
               (variant<ear::PolarScreen,_ear::CartesianScreen> *)
               &(layout->_screen).super_type.m_storage);
    (this->_layout)._screen.super_type.m_initialized = true;
  }
  Layout::withoutLfe(&local_98,&this->_layout);
  this_00 = &this->_pointSourcePanner;
  configurePolarPanner((ear *)this_00,&local_98);
  if (local_98._screen.super_type.m_initialized == true) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)
               &local_98._screen.super_type.m_storage);
    local_98._screen.super_type.m_initialized = false;
  }
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_98._channels);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._name._M_dataplus._M_p != &local_98._name.field_2) {
    operator_delete(local_98._name._M_dataplus._M_p,local_98._name.field_2._M_allocated_capacity + 1
                   );
  }
  PolarExtent::PolarExtent(&this->_polarExtentPanner,this_00);
  Layout::isLfe((vector<bool,_std::allocator<bool>_> *)&local_98,layout);
  copy_vector<Eigen::Array<bool,__1,_1,_0,__1,_1>,_std::vector<bool,_std::allocator<bool>_>,_0>
            ((ear *)&this->_isLfe,(vector<bool,_std::allocator<bool>_> *)&local_98);
  if (local_98._name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_98._name._M_dataplus._M_p,
                    (long)local_98._channels.
                          super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)local_98._name._M_dataplus._M_p);
  }
  uVar2 = (*((this_00->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_PointSourcePanner[1])();
  (this->_pvTmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->_pvTmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  if (-1 < (int)uVar2) {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)&this->_pvTmp,(ulong)uVar2,(ulong)uVar2,1);
    return;
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

GainCalculatorObjectsImpl::GainCalculatorObjectsImpl(const Layout& layout)
      : _layout(layout),
        _pointSourcePanner(configurePolarPanner(_layout.withoutLfe())),
        _polarExtentPanner(_pointSourcePanner),
        _isLfe(copy_vector<decltype(_isLfe)>(layout.isLfe())),
        _pvTmp(_pointSourcePanner->numberOfOutputChannels()){}